

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::sortTests(IConfig *config,
                vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases)

{
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  __last;
  int iVar1;
  iterator __first;
  long *in_RSI;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_RDI;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unaff_retaddr;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *sorted;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this;
  undefined4 in_stack_ffffffffffffffb8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffffc0;
  
  this = in_RDI;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector(unaff_retaddr,in_RDI);
  iVar1 = (**(code **)(*in_RSI + 0x70))();
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(this);
      __first = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(this);
      __last._M_current._4_4_ = iVar1;
      __last._M_current._0_4_ = in_stack_ffffffffffffffb8;
      std::
      sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>>
                ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )__first._M_current,__last);
    }
    else if (iVar1 == 2) {
      seedRng((IConfig *)0x1d33a4);
      RandomNumberGenerator::shuffle<std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
                (in_stack_ffffffffffffffc0);
    }
  }
  return in_RDI;
}

Assistant:

inline std::vector<TestCase> sortTests( IConfig const& config, std::vector<TestCase> const& unsortedTestCases ) {

        std::vector<TestCase> sorted = unsortedTestCases;

        switch( config.runOrder() ) {
            case RunTests::InLexicographicalOrder:
                std::sort( sorted.begin(), sorted.end() );
                break;
            case RunTests::InRandomOrder:
                {
                    seedRng( config );
                    RandomNumberGenerator::shuffle( sorted );
                }
                break;
            case RunTests::InDeclarationOrder:
                // already in declaration order
                break;
        }
        return sorted;
    }